

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Glucose::SimpSolver::cleanUpClauses(SimpSolver *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::cleanAll
            (&this->occurs);
  iVar6 = (this->super_Solver).clauses.sz;
  if (iVar6 < 1) {
    iVar5 = 0;
  }
  else {
    puVar2 = (this->super_Solver).clauses.data;
    puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
    lVar4 = 0;
    iVar5 = 0;
    do {
      uVar1 = puVar2[lVar4];
      if ((puVar3[uVar1] & 3) == 0) {
        lVar7 = (long)iVar5;
        iVar5 = iVar5 + 1;
        puVar2[lVar7] = uVar1;
      }
      lVar4 = lVar4 + 1;
      iVar6 = (this->super_Solver).clauses.sz;
    } while (lVar4 < iVar6);
    iVar5 = (int)lVar4 - iVar5;
  }
  if (0 < iVar5) {
    (this->super_Solver).clauses.sz = iVar6 - iVar5;
  }
  return;
}

Assistant:

void SimpSolver::cleanUpClauses()
{
    occurs.cleanAll();
    int i,j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() == 0)
            clauses[j++] = clauses[i];
    clauses.shrink(i - j);
}